

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O3

UBool locale_cleanup(void)

{
  UMemory *this;
  void *in_RSI;
  long lVar1;
  long lVar2;
  
  if (icu_63::gLocaleCache != 0) {
    this = (UMemory *)(icu_63::gLocaleCache + -8);
    if (*(long *)(icu_63::gLocaleCache + -8) != 0) {
      lVar1 = icu_63::gLocaleCache + -0xe0;
      lVar2 = *(long *)(icu_63::gLocaleCache + -8) * 0xe0;
      do {
        icu_63::Locale::~Locale((Locale *)(lVar1 + lVar2));
        lVar2 = lVar2 + -0xe0;
      } while (lVar2 != 0);
    }
    icu_63::UMemory::operator_delete__(this,in_RSI);
  }
  icu_63::gLocaleCache = 0;
  LOCK();
  icu_63::gLocaleCacheInitOnce = 0;
  UNLOCK();
  if (icu_63::gDefaultLocalesHashT != (UHashtable *)0x0) {
    uhash_close_63(icu_63::gDefaultLocalesHashT);
    icu_63::gDefaultLocalesHashT = (UHashtable *)0x0;
  }
  icu_63::gDefaultLocale = 0;
  return '\x01';
}

Assistant:

static UBool U_CALLCONV locale_cleanup(void)
{
    U_NAMESPACE_USE

    delete [] gLocaleCache;
    gLocaleCache = NULL;
    gLocaleCacheInitOnce.reset();

    if (gDefaultLocalesHashT) {
        uhash_close(gDefaultLocalesHashT);   // Automatically deletes all elements, using deleter func.
        gDefaultLocalesHashT = NULL;
    }
    gDefaultLocale = NULL;
    return TRUE;
}